

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

bool __thiscall
Formula_Constraint::Get
          (Formula_Constraint *this,Am_Slot *fetching_slot,Am_Value *value,bool *changed)

{
  Am_ID_Tag AVar1;
  Am_Wrapper *pAVar2;
  Am_Method_Wrapper *in_value;
  Am_Value local_d0;
  Am_Value local_c0;
  Am_Wrapper *local_b0;
  char *hold_2;
  char *hold_1;
  double hold;
  Am_Constraint_Context *old_cc;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object owner;
  Formula_Context fc;
  bool *changed_local;
  Am_Value *value_local;
  Am_Slot *fetching_slot_local;
  Formula_Constraint *this_local;
  
  fc._64_8_ = changed;
  Formula_Context::Formula_Context((Formula_Context *)&owner,this,fetching_slot,this->depends_on);
  Am_Slot::Get_Owner((Am_Slot *)&local_80);
  Am_Object::Am_Object(&local_78,&local_80);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_80);
  hold = (double)Am_Object_Advanced::Swap_Context((Am_Constraint_Context *)&owner);
  switch(this->type) {
  case F_WRAPPER:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,pAVar2);
    break;
  case F_VOID:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,pAVar2);
    break;
  case F_INT:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(int)pAVar2);
    break;
  case F_LONG:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(long)pAVar2);
    break;
  case F_BOOL:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(bool)((byte)pAVar2 & 1));
    break;
  case F_FLOAT:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(float)pAVar2);
    break;
  case F_DOUBLE:
    hold_1 = (char *)(*(this->formula).f_wrapper)(&local_78);
    if (((byte)fc.context & 1) == 0) {
      Am_Value::operator=(value,(double)hold_1);
    }
    break;
  case F_CHAR:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(char)pAVar2);
    break;
  case F_STRING:
    hold_2 = (char *)(*(this->formula).f_wrapper)(&local_78);
    if (((byte)fc.context & 1) == 0) {
      Am_Value::operator=(value,hold_2);
    }
    break;
  case F_CONST_STRING:
    local_b0 = (*(this->formula).f_wrapper)(&local_78);
    if (((byte)fc.context & 1) == 0) {
      Am_Value::operator=(value,(char *)local_b0);
    }
    break;
  case F_PROC:
    pAVar2 = (*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,(Am_Generic_Procedure *)pAVar2);
    break;
  case F_METHOD:
    in_value = (Am_Method_Wrapper *)(*(this->formula).f_wrapper)(&local_78);
    Am_Value::operator=(value,in_value);
    break;
  case F_VALUE:
    (*(this->formula).f_wrapper)((Am_Object *)&local_c0);
    Am_Value::operator=(value,&local_c0);
    Am_Value::~Am_Value(&local_c0);
    AVar1 = Am_Type_Class(value->type);
    if (AVar1 == 0x1000) {
      Am_Value::Set_Empty(value);
    }
    break;
  case F_CONST_VALUE:
    (*(this->formula).f_wrapper)((Am_Object *)&local_d0);
    Am_Value::operator=(value,&local_d0);
    Am_Value::~Am_Value(&local_d0);
    AVar1 = Am_Type_Class(value->type);
    if (AVar1 == 0x1000) {
      Am_Value::Set_Empty(value);
    }
  }
  Am_Object_Advanced::Swap_Context((Am_Constraint_Context *)hold);
  Formula_Context::Clean_Up((Formula_Context *)&owner,&this->depends_on);
  *(byte *)fc._64_8_ = (byte)fc.context & 1;
  if ((fc.context._1_1_ & 1) == 0) {
    Am_Value::operator=(value,(Am_Value *)&fc.changed);
    Am_Value::Set_Value_Type(value,0x1001);
  }
  Am_Object::~Am_Object(&local_78);
  Formula_Context::~Formula_Context((Formula_Context *)&owner);
  return (bool)(fc.exception.value.char_value & 1);
}

Assistant:

bool
Formula_Constraint::Get(const Am_Slot &fetching_slot, Am_Value &value,
                        bool &changed)
{
  Formula_Context fc(this, fetching_slot, depends_on);

  Am_Object owner = context.Get_Owner();

  Am_PUSH_CC(&fc) switch (type)
  {
  case F_WRAPPER:
    value = formula.f_wrapper(owner);
    break;
  case F_VOID:
    value = formula.f_void(owner);
    break;
  case F_INT:
    value = formula.f_int(owner);
    break;
  case F_LONG:
    value = formula.f_long(owner);
    break;
  case F_BOOL:
    value = formula.f_bool(owner);
    break;
  case F_FLOAT:
    value = formula.f_float(owner);
    break;
  case F_DOUBLE: {
    double hold = formula.f_double(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_CHAR:
    value = formula.f_char(owner);
    break;
  case F_STRING: {
    const char *hold = formula.f_string(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_CONST_STRING: {
    const char *hold = formula.f_const_string(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_PROC:
    value = formula.f_proc(owner);
    break;
  case F_METHOD:
    value = formula.f_method(owner);
    break;
  case F_VALUE:
    value = formula.f_value(owner);
    if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
      value.Set_Empty();
    break;
  case F_CONST_VALUE:
    value = formula.f_const_value(owner);
    if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
      value.Set_Empty();
    break;
  }
  Am_POP_CC()

      fc.Clean_Up(&depends_on);
  changed = fc.changed;
  if (!fc.inited) {
    value = fc.exception;
    value.Set_Value_Type(Am_FORMULA_INVALID);
  }
  return fc.return_value_from_get;
}